

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupOntop(Gia_Man_t *p,Gia_Man_t *p2)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  int *piVar6;
  int iVar7;
  uint uVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Gia_Obj_t *pGVar11;
  Vec_Int_t *pVVar12;
  Gia_Man_t *pGVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  
  if (p->vCos->nSize - p->nRegs != p2->vCis->nSize - p2->nRegs) {
    __assert_fail("Gia_ManPoNum(p) == Gia_ManPiNum(p2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x90b,"Gia_Man_t *Gia_ManDupOntop(Gia_Man_t *, Gia_Man_t *)");
  }
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x90c,"Gia_Man_t *Gia_ManDupOntop(Gia_Man_t *, Gia_Man_t *)");
  }
  if (p2->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p2) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x90d,"Gia_Man_t *Gia_ManDupOntop(Gia_Man_t *, Gia_Man_t *)");
  }
  p_00 = Gia_ManStart(p2->nObjs + p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar2);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar2);
  }
  p_00->pName = pcVar10;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar2);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar2);
  }
  p_00->pSpec = pcVar10;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  pVVar12 = p->vCis;
  if (0 < pVVar12->nSize) {
    lVar16 = 0;
    do {
      iVar7 = pVVar12->pArray[lVar16];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_001e6690;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar4 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar5 = p_00->pObjs;
      if ((pGVar11 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar11)) {
LAB_001e66af:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar11 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar11)) goto LAB_001e66af;
      pGVar3[iVar7].Value = (int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * 0x55555556;
      lVar16 = lVar16 + 1;
      pVVar12 = p->vCis;
    } while (lVar16 < pVVar12->nSize);
  }
  iVar7 = p->nObjs;
  if (0 < iVar7) {
    lVar16 = 8;
    lVar17 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar4 = *(ulong *)((long)pGVar3 + lVar16 + -8);
      if ((uVar4 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar4) {
        uVar8 = *(uint *)((long)pGVar3 + lVar16 + (ulong)(uint)((int)(uVar4 & 0x1fffffff) << 2) * -3
                         );
        if (((int)uVar8 < 0) ||
           (uVar14 = *(uint *)((long)pGVar3 +
                              lVar16 + (ulong)((uint)(uVar4 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar14 < 0)) goto LAB_001e66ce;
        iVar7 = Gia_ManHashAnd(p_00,uVar8 ^ (uint)(uVar4 >> 0x1d) & 1,
                               uVar14 ^ (uint)(uVar4 >> 0x3d) & 1);
        *(int *)(&pGVar3->field_0x0 + lVar16) = iVar7;
        iVar7 = p->nObjs;
      }
      lVar17 = lVar17 + 1;
      lVar16 = lVar16 + 0xc;
    } while (lVar17 < iVar7);
  }
  pGVar3 = p2->pObjs;
  pGVar3->Value = 0;
  lVar16 = (long)p->vCos->nSize;
  if (0 < lVar16) {
    piVar6 = p->vCos->pArray;
    lVar17 = 0;
    do {
      iVar1 = piVar6[lVar17];
      if (((long)iVar1 < 0) || (iVar7 <= iVar1)) goto LAB_001e6690;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar5 = p->pObjs + iVar1;
      uVar14 = (uint)*(undefined8 *)pGVar5;
      uVar8 = pGVar5[-(ulong)(uVar14 & 0x1fffffff)].Value;
      if ((int)uVar8 < 0) goto LAB_001e66ce;
      lVar15 = (long)p2->vCis->nSize;
      if (lVar15 - p2->nRegs <= lVar17) {
        __assert_fail("v < Gia_ManPiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
      }
      if (lVar15 <= lVar17) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p2->vCis->pArray[lVar17];
      if (((long)iVar1 < 0) || (p2->nObjs <= iVar1)) goto LAB_001e6690;
      pGVar3[iVar1].Value = uVar14 >> 0x1d & 1 ^ uVar8;
      lVar17 = lVar17 + 1;
    } while (lVar16 != lVar17);
  }
  iVar7 = p2->nObjs;
  if (0 < iVar7) {
    lVar17 = 8;
    lVar16 = 0;
    do {
      pGVar3 = p2->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar4 = *(ulong *)((long)pGVar3 + lVar17 + -8);
      if ((uVar4 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar4) {
        uVar8 = *(uint *)((long)pGVar3 + lVar17 + (ulong)(uint)((int)(uVar4 & 0x1fffffff) << 2) * -3
                         );
        if (((int)uVar8 < 0) ||
           (uVar14 = *(uint *)((long)pGVar3 +
                              lVar17 + (ulong)((uint)(uVar4 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar14 < 0)) goto LAB_001e66ce;
        iVar7 = Gia_ManHashAnd(p_00,uVar8 ^ (uint)(uVar4 >> 0x1d) & 1,
                               uVar14 ^ (uint)(uVar4 >> 0x3d) & 1);
        *(int *)(&pGVar3->field_0x0 + lVar17) = iVar7;
        iVar7 = p2->nObjs;
      }
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 0xc;
    } while (lVar16 < iVar7);
  }
  pVVar12 = p2->vCos;
  if (0 < pVVar12->nSize) {
    lVar16 = 0;
    do {
      iVar7 = pVVar12->pArray[lVar16];
      if (((long)iVar7 < 0) || (p2->nObjs <= iVar7)) {
LAB_001e6690:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p2->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p2->pObjs + iVar7;
      if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0) {
LAB_001e66ce:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar8 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                   pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value)
      ;
      pGVar3->Value = uVar8;
      lVar16 = lVar16 + 1;
      pVVar12 = p2->vCos;
    } while (lVar16 < pVVar12->nSize);
  }
  Gia_ManHashStop(p_00);
  pGVar13 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar13;
}

Assistant:

Gia_Man_t * Gia_ManDupOntop( Gia_Man_t * p, Gia_Man_t * p2 )
{
    Gia_Man_t * pTemp, * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManPoNum(p) == Gia_ManPiNum(p2) );
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManRegNum(p2) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p)+Gia_ManObjNum(p2) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    // dup first AIG
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // dup second AIG
    Gia_ManConst0(p2)->Value = 0;
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManPi(p2, i)->Value = Gia_ObjFanin0Copy(pObj);
    Gia_ManForEachAnd( p2, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p2, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
//    Gia_ManPrintStats( pGiaNew, 0 );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}